

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Klex.cpp
# Opt level: O1

bool __thiscall Klex::nextToken(Klex *this)

{
  TokenType TVar1;
  char quote;
  bool isWord;
  string local_40;
  
  if (this->currentChar == -1) {
LAB_0010b32d:
    std::__cxx11::string::_M_replace
              ((ulong)&this->lexeme,0,(char *)(this->lexeme)._M_string_length,0x12014a);
    this->tokenType = EndOfFile;
    return false;
  }
  if ((this->isInterpolatedString == false) && (this->isSimpleString == false)) {
    skipWhitespace(this);
  }
  if (this->currentChar == -1) goto LAB_0010b32d;
  if (this->shouldParseOutString == true) {
    if (this->isSimpleString == true) {
      quote = '\'';
LAB_0010b2ef:
      parseOutString_abi_cxx11_(&local_40,this,quote);
      std::__cxx11::string::operator=((string *)&this->lexeme,(string *)&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      this->tokenType = String;
      this->shouldParseOutString = false;
      return true;
    }
    if (this->isInterpolatedString == true) {
      quote = '\"';
      goto LAB_0010b2ef;
    }
  }
  switch(this->charClass) {
  case DIGIT:
    parseOutNumber_abi_cxx11_(&local_40,this);
    std::__cxx11::string::operator=((string *)&this->lexeme,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    this->tokenType = Number;
    break;
  case LETTER:
    parseOutWord_abi_cxx11_(&local_40,this);
    std::__cxx11::string::operator=((string *)&this->lexeme,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    isWord = true;
    goto LAB_0010b524;
  case SINGLE_QUOTE:
    if (this->isSimpleString == false) {
      this->shouldParseOutString = true;
    }
    this->isSimpleString = (bool)(this->isSimpleString ^ 1);
    parseOutSymbol_abi_cxx11_(&local_40,this);
    std::__cxx11::string::operator=((string *)&this->lexeme,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    this->tokenType = SingleQuote;
    break;
  case DOUBLE_QUOTE:
    if (this->isInterpolatedString == false) {
      this->shouldParseOutString = true;
    }
    this->isInterpolatedString = (bool)(this->isInterpolatedString ^ 1);
    parseOutSymbol_abi_cxx11_(&local_40,this);
    std::__cxx11::string::operator=((string *)&this->lexeme,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    this->tokenType = DoubleQuote;
    break;
  case OTHER:
    parseOutSymbol_abi_cxx11_(&local_40,this);
    std::__cxx11::string::operator=((string *)&this->lexeme,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    isWord = false;
LAB_0010b524:
    TVar1 = getTokenTypeOfLexeme(this,&this->lexeme,isWord);
    this->tokenType = TVar1;
  }
  return true;
}

Assistant:

bool Klex::nextToken() {
    if(getChar() == EOF) {
        setTokenToEOF();
        return false;
    }

    if(!isInterpolatedString && !isSimpleString)
        skipWhitespace();

    if(getChar() == EOF) {
        setTokenToEOF();
        return false;
    }

    if(shouldParseOutString && isSimpleString) {
        lexeme = parseOutString('\'');
        tokenType = TokenType::String;
        shouldParseOutString = false;
        return true;
    }

    if(shouldParseOutString && isInterpolatedString) {
        lexeme = parseOutString('"');
        tokenType = TokenType::String;
        shouldParseOutString = false;
        return true;
    }

    switch(getCharClass()) {
        case CharClass::LETTER:
            lexeme = parseOutWord();
            tokenType = getTokenTypeOfLexeme(lexeme, true);
            break;
        case CharClass::DIGIT:
            lexeme = parseOutNumber();
            tokenType = TokenType::Number;
            break;
        case CharClass::SINGLE_QUOTE:
            if(!isSimpleString)
                shouldParseOutString = true;
            isSimpleString = !isSimpleString;
            lexeme = parseOutSymbol();
            tokenType = TokenType::SingleQuote;
            break;
        case CharClass::DOUBLE_QUOTE:
            if(!isInterpolatedString)
                shouldParseOutString = true;
            isInterpolatedString = !isInterpolatedString;
            lexeme = parseOutSymbol();
            tokenType = TokenType::DoubleQuote;
            break;
        case CharClass::OTHER:
            lexeme = parseOutSymbol();
            tokenType = getTokenTypeOfLexeme(lexeme);
            break;
    }

    return true;
}